

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::Config::inputFile(Config *this,string *filename)

{
  allocator<char> local_31;
  string local_30;
  
  if ((((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0
     ) {
    QUtil::make_shared_cstr((QUtil *)&local_30,filename);
    std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_30._M_string_length);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"input file has already been given",&local_31);
    usage(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::inputFile(std::string const& filename)
{
    if (o.m->infilename == nullptr) {
        o.m->infilename = QUtil::make_shared_cstr(filename);
    } else {
        usage("input file has already been given");
    }
    return this;
}